

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * __thiscall
QUtil::read_file_into_string_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,FILE *f,string_view filename)

{
  QUtil *__n;
  int iVar1;
  int iVar2;
  void *pvVar3;
  runtime_error *prVar4;
  qpdf_offset_t qVar5;
  allocator<char> local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  allocator<char> local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_2fa;
  allocator<char> local_2f9;
  string local_2f8 [8];
  string buffer;
  size_t n_read_1;
  size_t buf_size;
  string local_2c0;
  string local_2a0;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_189;
  string local_188;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  QUtil *local_58;
  size_t n_read;
  allocator<char> local_3a;
  undefined1 local_39;
  QUtil *local_38;
  size_t size;
  qpdf_offset_t o_size;
  FILE *f_local;
  string_view filename_local;
  string *result;
  
  filename_local._M_len = filename._M_len;
  o_size = (qpdf_offset_t)this;
  f_local = f;
  filename_local._M_str = (char *)__return_storage_ptr__;
  fseek((FILE *)this,0,2);
  size = tell((FILE *)o_size);
  if ((long)size < 0) {
    buffer.field_2._8_8_ = 0x2000;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2f8,0x2000,'\0',&local_2f9);
    std::allocator<char>::~allocator(&local_2f9);
    local_2fa = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    while (buffer.field_2._8_8_ == 0x2000) {
      pvVar3 = (void *)std::__cxx11::string::data();
      buffer.field_2._8_8_ = fread(pvVar3,1,0x2000,(FILE *)o_size);
      std::__cxx11::string::erase((ulong)local_2f8,buffer.field_2._8_8_);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    iVar2 = ferror((FILE *)o_size);
    if (iVar2 != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"failure reading file ",&local_361);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_388,(basic_string_view<char,_std::char_traits<char>_> *)&f_local,
                 &local_389);
      std::operator+(&local_340,&local_360,&local_388);
      std::operator+(&local_320,&local_340," into memory");
      std::runtime_error::runtime_error(prVar4,(string *)&local_320);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_2fa = 1;
    std::__cxx11::string::~string(local_2f8);
  }
  else {
    local_38 = (QUtil *)QIntC::to_size<long_long>((longlong *)&size);
    fseek((FILE *)o_size,0,0);
    __n = local_38;
    local_39 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(size_type)__n,'\0',&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    pvVar3 = (void *)std::__cxx11::string::data();
    qVar5 = o_size;
    local_58 = (QUtil *)fread(pvVar3,1,(size_t)local_38,(FILE *)o_size);
    iVar2 = (int)qVar5;
    if (local_58 != local_38) {
      iVar1 = ferror((FILE *)o_size);
      if (iVar1 != 0) {
        local_189 = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"failure reading file ",&local_119);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_140,(basic_string_view<char,_std::char_traits<char>_> *)&f_local
                   ,&local_141);
        std::operator+(&local_f8,&local_118,&local_140);
        std::operator+(&local_d8,&local_f8," into memory: read ");
        uint_to_string_abi_cxx11_(&local_168,local_58,0,iVar2);
        std::operator+(&local_b8,&local_d8,&local_168);
        std::operator+(&local_98,&local_b8,"; wanted ");
        uint_to_string_abi_cxx11_(&local_188,local_38,0,iVar2);
        std::operator+(&local_78,&local_98,&local_188);
        std::runtime_error::runtime_error(prVar4,(string *)&local_78);
        local_189 = 0;
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"premature eof reading file ",&local_251);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_278,(basic_string_view<char,_std::char_traits<char>_> *)&f_local,
                 &local_279);
      std::operator+(&local_230,&local_250,&local_278);
      std::operator+(&local_210,&local_230," into memory: read ");
      uint_to_string_abi_cxx11_(&local_2a0,local_58,0,iVar2);
      std::operator+(&local_1f0,&local_210,&local_2a0);
      std::operator+(&local_1d0,&local_1f0,"; wanted ");
      uint_to_string_abi_cxx11_(&local_2c0,local_38,0,iVar2);
      std::operator+(&local_1b0,&local_1d0,&local_2c0);
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::read_file_into_string(FILE* f, std::string_view filename)
{
    fseek(f, 0, SEEK_END);
    auto o_size = QUtil::tell(f);
    if (o_size >= 0) {
        // Seekable file
        auto size = QIntC::to_size(o_size);
        fseek(f, 0, SEEK_SET);
        std::string result(size, '\0');
        if (auto n_read = fread(result.data(), 1, size, f); n_read != size) {
            if (ferror(f)) {
                throw std::runtime_error(
                    std::string("failure reading file ") + std::string(filename) +
                    " into memory: read " + uint_to_string(n_read) + "; wanted " +
                    uint_to_string(size));
            } else {
                throw std::runtime_error(
                    std::string("premature eof reading file ") + std::string(filename) +
                    " into memory: read " + uint_to_string(n_read) + "; wanted " +
                    uint_to_string(size));
            }
        }
        return result;
    } else {
        // Pipe or other non-seekable file
        size_t buf_size = 8192;
        auto n_read = buf_size;
        std::string buffer(buf_size, '\0');
        std::string result;
        while (n_read == buf_size) {
            n_read = fread(buffer.data(), 1, buf_size, f);
            buffer.erase(n_read);
            result.append(buffer);
        }
        if (ferror(f)) {
            throw std::runtime_error(
                std::string("failure reading file ") + std::string(filename) + " into memory");
        }
        return result;
    }
}